

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm.cpp
# Opt level: O1

bool __thiscall pg::SPMSolver::pm_less(SPMSolver *this,int *a,int *b,int d,int pl)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  
  uVar2 = (ulong)pl;
  if (a[uVar2] != -1) {
    if (b[uVar2] == -1) {
      return true;
    }
    uVar5 = (uint)this->k;
    iVar4 = -1;
    if ((uVar5 & 1) == uVar2) {
      iVar4 = -2;
    }
    iVar4 = iVar4 + uVar5;
    if (d <= iVar4) {
      lVar3 = (long)iVar4;
      do {
        iVar4 = a[lVar3];
        iVar1 = b[lVar3];
        if (iVar4 != iVar1) {
          return iVar4 < iVar1 && (iVar1 <= this->counts[lVar3] || iVar4 <= this->counts[lVar3]);
        }
        lVar3 = lVar3 + -2;
      } while (d <= lVar3);
    }
  }
  return false;
}

Assistant:

bool
SPMSolver::pm_less(int* a, int* b, int d, int pl)
{
    // cases where a or b is Top
    if (a[pl] == -1) return false;
    if (b[pl] == -1) return true;
    // normal comparison, start with highest priority
    const int start = ((k&1) == pl) ? k-2 : k-1;
    for (int i=start; i>=d; i-=2) {
        if (a[i] == b[i]) continue;
        if (a[i] > counts[i] and b[i] > counts[i]) return false;
        return a[i] < b[i];
    }
    return false;
}